

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

bool processCmd(string *cmd)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  char *pcVar5;
  string *psVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  allocator local_1a4;
  allocator local_1a3;
  allocator local_1a2;
  allocator local_1a1;
  string *local_1a0;
  string sourcePath;
  allocator local_178 [32];
  path p;
  string possibleCmds [8];
  
  std::__cxx11::string::string((string *)possibleCmds,"put",(allocator *)&sourcePath);
  std::__cxx11::string::string((string *)(possibleCmds + 1),"read",(allocator *)&p);
  std::__cxx11::string::string((string *)(possibleCmds + 2),"mkdir",local_178);
  std::__cxx11::string::string((string *)(possibleCmds + 3),"put2",(allocator *)&x);
  std::__cxx11::string::string((string *)(possibleCmds + 4),"read2",&local_1a1);
  std::__cxx11::string::string((string *)(possibleCmds + 5),"quit",&local_1a2);
  local_1a0 = possibleCmds + 6;
  std::__cxx11::string::string((string *)local_1a0,"fetch",&local_1a3);
  std::__cxx11::string::string((string *)(possibleCmds + 7),"fetch2",&local_1a4);
  split(&x,cmd,' ');
  iVar2 = std::__cxx11::string::compare
                    ((string *)
                     x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (iVar2 == 0) {
    type = put;
    if ((long)x.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)x.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pcVar5 = "Usage: put source_file_path";
      goto LAB_00110056;
    }
    std::__cxx11::string::string
              ((string *)&sourcePath,
               (string *)
               (x.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1));
    std::ifstream::open((string *)ifs,(_Ios_Openmode)&sourcePath);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: the input file does not exist");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::__cxx11::string::string((string *)&p,(string *)&sourcePath);
      boost::filesystem::path::filename();
      std::__cxx11::string::append((string *)&desFileName_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)&p);
    }
LAB_0010fec9:
    std::__cxx11::string::~string((string *)&sourcePath);
    if (cVar1 != '\0') goto LAB_0010fedb;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((string *)
                       x.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) {
      type = read;
      if ((long)x.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)x.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x80) {
        read_fileId = std::__cxx11::stoi(x.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0
                                         ,10);
        read_offset = std::__cxx11::stoll(x.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2,
                                          (size_t *)0x0,10);
        read_count = std::__cxx11::stoi(x.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0,
                                        10);
        goto LAB_0010fedb;
      }
      pcVar5 = "Usage: read file_id offset count";
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((string *)
                         x.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        type = mkdir;
        if ((long)x.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)x.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          psVar6 = &mkdir_path_abi_cxx11_;
LAB_0010fe9b:
          std::__cxx11::string::_M_assign((string *)psVar6);
          goto LAB_0010fedb;
        }
        pcVar5 = "Usage: mkdir folder";
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((string *)
                           x.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (iVar2 == 0) {
          type = put2;
          if ((long)x.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)x.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) {
            std::__cxx11::string::string
                      ((string *)&sourcePath,
                       (string *)
                       (x.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1));
            std::ifstream::open((string *)ifs,(_Ios_Openmode)&sourcePath);
            cVar1 = std::__basic_file<char>::is_open();
            if (cVar1 == '\0') {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Error: the input file does not exist")
              ;
              std::endl<char,std::char_traits<char>>(poVar3);
            }
            else {
              std::__cxx11::string::_M_assign((string *)&desFileName_abi_cxx11_);
            }
            goto LAB_0010fec9;
          }
          pcVar5 = "Usage: put2 source_file_path des_file_folder";
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((string *)
                             x.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar2 == 0) {
            type = read2;
            if ((long)x.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)x.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x80) {
              std::__cxx11::string::_M_assign((string *)&read_filename_abi_cxx11_);
              read_offset = std::__cxx11::stoll(x.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 2,
                                                (size_t *)0x0,10);
              read_count = std::__cxx11::stoi(x.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 3,
                                              (size_t *)0x0,10);
              goto LAB_0010fedb;
            }
            pcVar5 = "Usage: read2 file_path offset count";
          }
          else {
            iVar2 = std::__cxx11::string::compare
                              ((string *)
                               x.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            if (iVar2 == 0) {
              poVar3 = std::operator<<((ostream *)&std::cout,"Bye: Exit miniDFS");
              std::endl<char,std::char_traits<char>>(poVar3);
              exit(0);
            }
            iVar2 = std::__cxx11::string::compare
                              ((string *)
                               x.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            if (iVar2 == 0) {
              type = fetch;
              if ((long)x.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)x.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x60) {
                fetch_id = std::__cxx11::stoi(x.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1,
                                              (size_t *)0x0,10);
                std::__cxx11::string::_M_assign((string *)&fetch_savepath_abi_cxx11_);
                goto LAB_0010fedb;
              }
              pcVar5 = "Usage: fetch file_id save_path";
            }
            else {
              iVar2 = std::__cxx11::string::compare
                                ((string *)
                                 x.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              if (iVar2 != 0) {
LAB_0010fedb:
                bVar4 = true;
                goto LAB_0011006c;
              }
              type = fetch2;
              if ((long)x.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)x.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x60) {
                std::__cxx11::string::_M_assign((string *)&fetch_filepath_abi_cxx11_);
                psVar6 = &fetch_savepath_abi_cxx11_;
                goto LAB_0010fe9b;
              }
              pcVar5 = "Usage: fetch2 file_path save_path";
            }
          }
        }
      }
    }
LAB_00110056:
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  bVar4 = false;
LAB_0011006c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&x);
  lVar7 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&possibleCmds[0]._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  return bVar4;
}

Assistant:

bool processCmd(const string& cmd)
{
    string possibleCmds[] = {"put", "read", "mkdir", "put2", "read2", "quit", "fetch", "fetch2"};

    vector<string> x = split(cmd, ' ');
    if (x[0].compare(possibleCmds[0]) == 0)
    {
        type = MsgType::put;
        if (x.size() != 2)
        {
            cerr << "Usage: put source_file_path" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        boost::filesystem::path p(sourcePath);

        desFileName += p.filename().string();

    }
    else if (x[0].compare(possibleCmds[1]) == 0)
    {
        type = MsgType::read;
        if (x.size() != 4)
        {
            cerr << "Usage: read file_id offset count" << endl;
            return false;
        }

        try {
            read_fileId = stoi(x[1]);
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: id, offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if(x[0].compare(possibleCmds[2]) == 0){
        type = MsgType::mkdir;
        if (x.size() != 2)
        {
            cerr << "Usage: mkdir folder" << endl;
            return false;
        }
        mkdir_path = x[1];

    }
    else if(x[0].compare(possibleCmds[3]) == 0)
    {
        type = MsgType::put2;
        if (x.size() != 3)
        {
            cerr << "Usage: put2 source_file_path des_file_folder" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        desFileName = x[2];

    }
    else if (x[0].compare(possibleCmds[4]) == 0)
    {
        type = MsgType::read2;
        if (x.size() != 4)
        {
            cerr << "Usage: read2 file_path offset count" << endl;
            return false;
        }

        read_filename = x[1];

        try {
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[5]) == 0)
    {
        cout << "Bye: Exit miniDFS" << endl;
        exit(0);
    }
    else if (x[0].compare(possibleCmds[6]) == 0)
    {
        type = MsgType::fetch;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch file_id save_path" << endl;
            return false;
        }

        try {
            fetch_id = stoi(x[1]);
            fetch_savepath = x[2];
        }
        catch (exception& e)
        {
            std::cout << "Error: id isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[7]) == 0)
    {
        type = MsgType::fetch2;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch2 file_path save_path" << endl;
            return false;
        }

        fetch_filepath = x[1];
        fetch_savepath = x[2];
    }

    return true;
}